

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project.cpp
# Opt level: O0

void __thiscall QMakeProject::dump(QMakeProject *this)

{
  bool bVar1;
  QStringBuilder<char,_QString> *b;
  const_iterator o;
  QString *s;
  char *__s;
  ProString *in_RDI;
  long in_FS_OFFSET;
  QString *v_1;
  add_const_t<QList<QString>_> *__range1;
  ProString *v;
  ProStringList *__range3;
  const_iterator __end1;
  const_iterator __begin1;
  const_iterator __end3;
  const_iterator __begin3;
  QString str;
  ConstIterator it;
  QStringList out;
  undefined4 in_stack_fffffffffffffed8;
  CaseSensitivity in_stack_fffffffffffffedc;
  QListSpecialMethods<QString> *in_stack_fffffffffffffee0;
  ProString *in_stack_fffffffffffffef0;
  QString *this_00;
  ProString *val;
  QChar in_stack_ffffffffffffff2e;
  const_iterator local_c0 [4];
  undefined1 local_99;
  ProString *local_78;
  const_iterator local_70;
  const_iterator local_68;
  QStringBuilder<const_ProKey_&,_const_char_(&)[3]> local_60;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  QChar local_32;
  const_iterator local_30;
  const_iterator local_28;
  QString local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_20.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  local_20.d.size = -0x5555555555555556;
  val = in_RDI;
  QList<QString>::QList((QList<QString> *)0x32d975);
  local_28._M_node = (_Base_ptr)0xaaaaaaaaaaaaaaaa;
  std::__cxx11::list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>::
  front((list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_> *)
        in_stack_fffffffffffffee0);
  local_28._M_node =
       (_Base_ptr)
       QMap<ProKey,_ProStringList>::begin((QMap<ProKey,_ProStringList> *)in_stack_fffffffffffffef0);
  while( true ) {
    std::__cxx11::list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>::
    front((list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_> *)
          in_stack_fffffffffffffee0);
    local_30._M_node =
         (_Base_ptr)
         QMap<ProKey,_ProStringList>::end((QMap<ProKey,_ProStringList> *)in_stack_fffffffffffffef0);
    bVar1 = ::operator!=((const_iterator *)in_stack_fffffffffffffee0,
                         (const_iterator *)
                         CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    if (!bVar1) break;
    in_stack_fffffffffffffee0 =
         (QListSpecialMethods<QString> *)
         QMap<ProKey,_ProStringList>::const_iterator::key((const_iterator *)0x32d9f1);
    QChar::QChar<char,_true>(&local_32,'.');
    bVar1 = ProString::startsWith
                      (in_stack_fffffffffffffef0,in_stack_ffffffffffffff2e,
                       (CaseSensitivity)((ulong)in_RDI >> 0x20));
    if (!bVar1) {
      local_50 = 0xaaaaaaaaaaaaaaaa;
      local_48 = 0xaaaaaaaaaaaaaaaa;
      local_40 = 0xaaaaaaaaaaaaaaaa;
      QMap<ProKey,_ProStringList>::const_iterator::key((const_iterator *)0x32da61);
      local_60 = ::operator+((ProKey *)in_stack_fffffffffffffee0,
                             (char (*) [3])
                             CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      ::QStringBuilder::operator_cast_to_QString
                ((QStringBuilder<const_ProKey_&,_const_char_(&)[3]> *)
                 CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      b = (QStringBuilder<char,_QString> *)
          QMap<ProKey,_ProStringList>::const_iterator::value((const_iterator *)0x32dab1);
      local_68.i = (ProString *)0xaaaaaaaaaaaaaaaa;
      local_68 = QList<ProString>::begin((QList<ProString> *)in_stack_fffffffffffffee0);
      local_70.i = (ProString *)0xaaaaaaaaaaaaaaaa;
      local_70 = QList<ProString>::end((QList<ProString> *)in_stack_fffffffffffffee0);
      while( true ) {
        local_78 = local_70.i;
        bVar1 = QList<ProString>::const_iterator::operator!=(&local_68,local_70);
        if (!bVar1) break;
        QList<ProString>::const_iterator::operator*(&local_68);
        local_99 = 0x20;
        QMakeEvaluator::formatValue(val,SUB81((ulong)b >> 0x38,0));
        ::operator+((char *)in_RDI,(QString *)in_stack_fffffffffffffee0);
        ::operator+=(&val->m_string,b);
        QStringBuilder<char,_QString>::~QStringBuilder((QStringBuilder<char,_QString> *)0x32db9c);
        QString::~QString((QString *)0x32dba6);
        QList<ProString>::const_iterator::operator++(&local_68);
      }
      QList<QString>::operator<<
                ((QList<QString> *)in_stack_fffffffffffffee0,
                 (parameter_type)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      QString::~QString((QString *)0x32dbda);
    }
    QMap<ProKey,_ProStringList>::const_iterator::operator++
              ((const_iterator *)in_stack_fffffffffffffee0);
  }
  QListSpecialMethods<QString>::sort(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
  this_00 = &local_20;
  local_c0[0].i = (QString *)0xaaaaaaaaaaaaaaaa;
  local_c0[0] = QList<QString>::begin((QList<QString> *)in_stack_fffffffffffffee0);
  o = QList<QString>::end((QList<QString> *)in_stack_fffffffffffffee0);
  while( true ) {
    bVar1 = QList<QString>::const_iterator::operator!=(local_c0,o);
    if (!bVar1) break;
    s = QList<QString>::const_iterator::operator*(local_c0);
    QtPrivate::asString(s);
    QString::toLocal8Bit(this_00);
    __s = QByteArray::constData((QByteArray *)0x32dcb0);
    puts(__s);
    QByteArray::~QByteArray((QByteArray *)0x32dcc2);
    QList<QString>::const_iterator::operator++(local_c0);
  }
  QList<QString>::~QList((QList<QString> *)0x32dcdb);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMakeProject::dump() const
{
    QStringList out;
    for (ProValueMap::ConstIterator it = m_valuemapStack.front().begin();
         it != m_valuemapStack.front().end(); ++it) {
        if (!it.key().startsWith('.')) {
            QString str = it.key() + " =";
            for (const ProString &v : it.value())
                str += ' ' + formatValue(v);
            out << str;
        }
    }
    out.sort();
    for (const QString &v : std::as_const(out))
        puts(qPrintable(v));
}